

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# additional.cpp
# Opt level: O0

BN * gcdInverseEuclidean(BN *__return_storage_ptr__,BN *a,BN *mod)

{
  bool bVar1;
  BN *bn;
  BN local_1e8;
  BN local_1d0;
  BNsign local_1b8;
  BNsign local_198;
  BNsign local_178;
  undefined1 local_158 [8];
  BN Mod;
  BN Div;
  undefined1 local_110 [8];
  BNsign x2;
  undefined1 local_d8 [8];
  BNsign x1;
  BNsign x0;
  BN local_90;
  undefined1 local_78 [8];
  BN B;
  undefined1 local_50 [8];
  BN A;
  BN startMod;
  BN *mod_local;
  BN *a_local;
  
  BN::BN((BN *)&A.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,mod);
  BN::operator%((BN *)local_50,a,mod);
  BN::BN((BN *)local_78,mod);
  bVar1 = BN::is0((BN *)local_50);
  if (bVar1) {
    BN::bn0();
    BN::BN(__return_storage_ptr__,&local_90);
    BN::~BN(&local_90);
    goto LAB_00111706;
  }
  BNsign::BNsign((BNsign *)&x1.sign);
  BN::bn0();
  BNsign::BNsign((BNsign *)local_d8,(BN *)&x2.sign,false);
  BN::~BN((BN *)&x2.sign);
  BN::bn1();
  BNsign::BNsign((BNsign *)local_110,
                 (BN *)&Div.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,false);
  BN::~BN((BN *)&Div.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
  BN::BN((BN *)&Mod.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  BN::BN((BN *)local_158);
  while( true ) {
    BN::divmod((BN *)local_78,(BN *)local_50,
               (BN *)&Mod.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(BN *)local_158);
    bVar1 = BN::is0((BN *)local_158);
    if (bVar1) break;
    BNsign::operator=((BNsign *)&x1.sign,(BNsign *)local_d8);
    BNsign::operator=((BNsign *)local_d8,(BNsign *)local_110);
    BNsign::BNsign(&local_1b8,
                   (BN *)&Mod.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
    BNsign::operator*(&local_198,(BNsign *)local_d8,&local_1b8);
    BNsign::operator-(&local_178,(BNsign *)&x1.sign,&local_198);
    BNsign::operator=((BNsign *)local_110,&local_178);
    BNsign::~BNsign(&local_178);
    BNsign::~BNsign(&local_198);
    BNsign::~BNsign(&local_1b8);
    BN::operator=((BN *)local_78,(BN *)local_50);
    BN::operator=((BN *)local_50,(BN *)local_158);
  }
  BN::bn1();
  bVar1 = BN::operator!=((BN *)local_50,&local_1d0);
  BN::~BN(&local_1d0);
  if (bVar1) {
    BN::bn0();
    BN::BN(__return_storage_ptr__,&local_1e8);
    BN::~BN(&local_1e8);
  }
  else {
    if (((byte)x2.value.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0) {
      bVar1 = BN::is0((BN *)local_110);
      if (!bVar1) {
        bn = BN::operator-=((BN *)&A.ba.
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (BN *)local_110);
        BN::BN(__return_storage_ptr__,bn);
        goto LAB_0011168a;
      }
    }
    BN::BN(__return_storage_ptr__,(BN *)local_110);
  }
LAB_0011168a:
  BN::~BN((BN *)local_158);
  BN::~BN((BN *)&Mod.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
  BNsign::~BNsign((BNsign *)local_110);
  BNsign::~BNsign((BNsign *)local_d8);
  BNsign::~BNsign((BNsign *)&x1.sign);
LAB_00111706:
  BN::~BN((BN *)local_78);
  BN::~BN((BN *)local_50);
  BN::~BN((BN *)&A.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

BN gcdInverseEuclidean(const BN& a, const BN& mod)
{
    BN startMod(mod);

    BN A(a % mod);
    BN B(mod);

    if(A.is0())
        return move(BN::bn0());

    BNsign x0;
    BNsign x1(BN::bn0());
    BNsign x2(BN::bn1());
    BN Div;
    BN Mod;
    while (true) {
        B.divmod(A, Div, Mod);
        if (Mod.is0())
            break;
        x0 = move(x1);
        x1 = move(x2);

        x2 = x0 - x1 * (BNsign)Div;

        B = move(A);
        A = move(Mod);
    }

    if(A != BN::bn1())
        return move(BN::bn0());
    if(x2.sign && !x2.value.is0())
        return move(startMod -= x2.value);
    return move(x2.value);
}